

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int setup_initial_encryption
              (ptls_cipher_suite_t *cs,st_quicly_cipher_context_t *ingress,
              st_quicly_cipher_context_t *egress,ptls_iovec_t cid,int is_client,ptls_iovec_t salt,
              quicly_conn_t *conn)

{
  long in_RDX;
  long in_RSI;
  int ret;
  uint8_t secret [64];
  int local_7c;
  undefined1 local_78 [8];
  void *in_stack_ffffffffffffff90;
  ptls_hash_algorithm_t *in_stack_ffffffffffffff98;
  ptls_iovec_t in_stack_ffffffffffffffa0;
  ptls_iovec_t in_stack_ffffffffffffffb0;
  
  local_7c = ptls_hkdf_extract(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0);
  if (((local_7c == 0) &&
      (((in_RSI == 0 ||
        (local_7c = setup_initial_key((st_quicly_cipher_context_t *)secret._48_8_,
                                      (ptls_cipher_suite_t *)secret._40_8_,(void *)secret._32_8_,
                                      (char *)secret._24_8_,secret._20_4_,
                                      (quicly_conn_t *)secret._8_8_), local_7c == 0)) &&
       (in_RDX != 0)))) &&
     ((local_7c = setup_initial_key((st_quicly_cipher_context_t *)secret._48_8_,
                                    (ptls_cipher_suite_t *)secret._40_8_,(void *)secret._32_8_,
                                    (char *)secret._24_8_,secret._20_4_,
                                    (quicly_conn_t *)secret._8_8_), local_7c != 0 && (in_RSI != 0)))
     ) {
    dispose_cipher((st_quicly_cipher_context_t *)0x134d91);
  }
  (*ptls_clear_memory)(local_78,0x40);
  return local_7c;
}

Assistant:

static int setup_initial_encryption(ptls_cipher_suite_t *cs, struct st_quicly_cipher_context_t *ingress,
                                    struct st_quicly_cipher_context_t *egress, ptls_iovec_t cid, int is_client, ptls_iovec_t salt,
                                    quicly_conn_t *conn)
{
    static const char *labels[2] = {"client in", "server in"};
    uint8_t secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    /* extract master secret */
    if ((ret = ptls_hkdf_extract(cs->hash, secret, salt, cid)) != 0)
        goto Exit;

    /* create aead contexts */
    if (ingress != NULL && (ret = setup_initial_key(ingress, cs, secret, labels[is_client], 0, conn)) != 0)
        goto Exit;
    if (egress != NULL && (ret = setup_initial_key(egress, cs, secret, labels[!is_client], 1, conn)) != 0) {
        if (ingress != NULL)
            dispose_cipher(ingress);
        goto Exit;
    }

Exit:
    ptls_clear_memory(secret, sizeof(secret));
    return ret;
}